

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

TypeDef winmd::reader::find_required(TypeRef *type)

{
  pointer pTVar1;
  pointer pTVar2;
  cache *this;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *pvVar3;
  __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  _Var4;
  coded_index<winmd::reader::ResolutionScope> cVar5;
  TypeDef TVar6;
  string_view sVar7;
  row_base<winmd::reader::TypeDef> rVar8;
  allocator<char> local_71;
  string_view local_70;
  string_view local_60;
  string local_50;
  string_view local_30;
  
  local_60._M_str._4_4_ = (undefined4)(local_60._M_len >> 0x20);
  local_70._M_str._4_4_ = (undefined4)(local_70._M_len >> 0x20);
  cVar5 = TypeRef::ResolutionScope(type);
  if ((~cVar5.super_typed_index<winmd::reader::ResolutionScope>.
        super_index_base<winmd::reader::ResolutionScope>.m_value & 3) == 0) {
    cVar5 = TypeRef::ResolutionScope(type);
    local_70._M_str._0_4_ =
         (cVar5.super_typed_index<winmd::reader::ResolutionScope>.
          super_index_base<winmd::reader::ResolutionScope>.m_value >> 2) - 1;
    local_70._M_len =
         (size_t)(cVar5.super_typed_index<winmd::reader::ResolutionScope>.
                  super_index_base<winmd::reader::ResolutionScope>.m_table)->m_database;
    TVar6 = find_required((TypeRef *)&local_70);
    local_60._0_12_ = TVar6.super_row_base<winmd::reader::TypeDef>._0_12_;
    pvVar3 = cache::nested_types((TVar6.super_row_base<winmd::reader::TypeDef>.m_table)->m_database
                                 ->m_cache,(TypeDef *)&local_60);
    pTVar1 = (pvVar3->
             super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (pvVar3->
             super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    sVar7 = TypeRef::TypeName(type);
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<winmd::reader::TypeDef_const*,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>>,__gnu_cxx::__ops::_Iter_pred<winmd::reader::find_required(winmd::reader::TypeRef_const&)::_lambda(winmd::reader::TypeDef_const&)_1_>>
                      (pTVar1,pTVar2,sVar7._M_len,sVar7._M_str);
    if (_Var4._M_current ==
        (pvVar3->super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Type \'",&local_71);
      local_70 = TypeDef::TypeName((TypeDef *)&local_60);
      local_30 = TypeRef::TypeName(type);
      impl::
      throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[2],std::basic_string_view<char,std::char_traits<char>>,char[21]>
                (&local_50,&local_70,(char (*) [2])0x17b628,&local_30,
                 (char (*) [21])"\' could not be found");
    }
    rVar8._12_4_ = 0;
    rVar8.m_table = ((_Var4._M_current)->super_row_base<winmd::reader::TypeDef>).m_table;
    rVar8.m_index = ((_Var4._M_current)->super_row_base<winmd::reader::TypeDef>).m_index;
  }
  else {
    this = ((type->super_row_base<winmd::reader::TypeRef>).m_table)->m_database->m_cache;
    local_60 = TypeRef::TypeNamespace(type);
    local_70 = TypeRef::TypeName(type);
    rVar8 = (row_base<winmd::reader::TypeDef>)cache::find_required(this,&local_60,&local_70);
  }
  return (TypeDef)rVar8;
}

Assistant:

inline auto find_required(TypeRef const& type)
    {
        if (type.ResolutionScope().type() != ResolutionScope::TypeRef)
        {
            return type.get_database().get_cache().find_required(type.TypeNamespace(), type.TypeName());
        }
        else
        {
            auto enclosing_type = find_required(type.ResolutionScope().TypeRef());
            auto const& nested_types = enclosing_type.get_cache().nested_types(enclosing_type);
            auto iter = std::find_if(nested_types.begin(), nested_types.end(),
                [name = type.TypeName()](TypeDef const& arg)
            {
                return name == arg.TypeName();
            });
            if (iter == nested_types.end())
            {
                impl::throw_invalid("Type '", enclosing_type.TypeName(), ".", type.TypeName(), "' could not be found");
            }
            return *iter;
        }
    }